

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_nan_Test::TestBody(unitStrings_nan_Test *this)

{
  bool bVar1;
  int iVar2;
  precise_unit *ppVar3;
  char *pcVar4;
  precise_unit *un;
  uint64_t uVar5;
  unit *units;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  string *__return_storage_ptr___00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr___01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  char *in_R9;
  double dVar6;
  double __value;
  precise_unit pVar7;
  string local_2d0;
  AssertHelper local_2b0;
  Message local_2a8;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__1;
  Message local_280;
  precise_unit local_278;
  unit_data local_268;
  unit_data local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_5;
  string local_248;
  undefined1 local_228 [8];
  precise_unit retunit;
  Message local_210;
  unit local_208;
  unit local_200;
  string local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  Message local_1c0;
  precise_unit local_1b8;
  precise_unit local_1a8;
  string local_198;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  precise_unit nanresult;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  string res;
  precise_unit nanunit;
  Message local_98;
  string local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_nan_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ppVar3 = (precise_unit *)::units::getDefaultFlags();
  __return_storage_ptr__ = &local_40;
  ::units::to_string_abi_cxx11_
            (__return_storage_ptr__,(units *)::units::precise::error,ppVar3,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_20,"to_string(precise::error)","\"ERROR\"",__return_storage_ptr__,
             (char (*) [6])0x27e9a4);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    __return_storage_ptr__ = (string *)0x10e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x10e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  ppVar3 = (precise_unit *)::units::getDefaultFlags();
  __return_storage_ptr___00 = &local_90;
  ::units::to_string_abi_cxx11_
            (__return_storage_ptr___00,(units *)::units::precise::invalid,ppVar3,
             (uint64_t)__return_storage_ptr__);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
            ((EqHelper *)local_70,"to_string(precise::invalid)","\"NaN*ERROR\"",
             __return_storage_ptr___00,(char (*) [10])"NaN*ERROR");
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    __return_storage_ptr___00 = (string *)0x110;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nanunit.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x110,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&nanunit.base_units_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nanunit.base_units_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  dVar6 = std::numeric_limits<double>::quiet_NaN();
  ppVar3 = (precise_unit *)((long)&res.field_2 + 8);
  ::units::precise_unit::precise_unit(ppVar3,dVar6,(precise_unit *)::units::precise::one);
  un = (precise_unit *)::units::getDefaultFlags();
  __return_storage_ptr___01 = &gtest_ar_2.message_;
  ::units::to_string_abi_cxx11_
            ((string *)__return_storage_ptr___01,(units *)ppVar3,un,
             (uint64_t)__return_storage_ptr___00);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_e0,"res","\"NaN\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr___01,(char (*) [4])0x2902f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    __return_storage_ptr___01 =
         (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x114;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nanresult.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x114,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&nanresult.base_units_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nanresult.base_units_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::__cxx11::string::string((string *)&gtest_ar_.message_,(string *)&gtest_ar_2.message_);
  uVar5 = ::units::getDefaultFlags();
  pVar7 = ::units::unit_from_string((string *)&gtest_ar_.message_,uVar5);
  nanresult.multiplier_ = pVar7._8_8_;
  dVar6 = (double)std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  iVar2 = ::units::isnan(dVar6);
  local_131 = (bool)((byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_130,
               (AssertionResult *)"isnan(nanresult)","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    __return_storage_ptr___01 =
         (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x116;
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x116,pcVar4);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_1b8 = ::units::precise_unit::operator*
                        ((precise_unit *)((long)&res.field_2 + 8),
                         (precise_unit *)::units::precise::m);
  local_1a8 = ::units::precise_unit::operator/(&local_1b8,(precise_unit *)::units::precise::s);
  ppVar3 = (precise_unit *)::units::getDefaultFlags();
  ::units::to_string_abi_cxx11_
            (&local_198,(units *)&local_1a8,ppVar3,(uint64_t)__return_storage_ptr___01);
  lhs = &local_198;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_178,"to_string(nanunit * precise::m / precise::s)","\"NaN*m/s\"",lhs,
             (char (*) [8])"NaN*m/s");
  std::__cxx11::string::~string((string *)&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x117;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x117,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  dVar6 = std::numeric_limits<double>::signaling_NaN();
  local_208 = ::units::unit::operator/((unit *)&::units::m,(unit *)&::units::s);
  ::units::unit::unit(&local_200,dVar6,&local_208);
  units = (unit *)::units::getDefaultFlags();
  ::units::to_string_abi_cxx11_(&local_1f8,(units *)&local_200,units,(uint64_t)lhs);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_1d8,
             "to_string(unit(std::numeric_limits<double>::signaling_NaN(), m / s))","\"NaN*m/s\"",
             &local_1f8,(char (*) [8])"NaN*m/s");
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&retunit.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x11b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&retunit.base_units_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&retunit.base_units_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_248,"NaN*m/s",
             (allocator *)
             ((long)&gtest_ar_5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar5 = ::units::getDefaultFlags();
  pVar7 = ::units::unit_from_string(&local_248,uVar5);
  retunit.multiplier_ = pVar7._8_8_;
  local_228 = (undefined1  [8])pVar7.multiplier_;
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_264 = ::units::precise_unit::base_units((precise_unit *)local_228);
  local_278 = ::units::precise_unit::operator/
                        ((precise_unit *)::units::precise::m,(precise_unit *)::units::precise::s);
  local_268 = ::units::precise_unit::base_units(&local_278);
  testing::internal::EqHelper::Compare<units::detail::unit_data,_units::detail::unit_data,_nullptr>
            ((EqHelper *)local_260,"retunit.base_units()","(precise::m / precise::s).base_units()",
             &local_264,&local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x11d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  iVar2 = ::units::isnan(__value);
  local_299 = (bool)((byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_298,&local_299,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d0,(internal *)local_298,(AssertionResult *)"isnan(retunit)","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x11e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  return;
}

Assistant:

TEST(unitStrings, nan)
{
    EXPECT_EQ(to_string(precise::error), "ERROR");

    EXPECT_EQ(to_string(precise::invalid), "NaN*ERROR");
    auto nanunit =
        precise_unit(std::numeric_limits<double>::quiet_NaN(), precise::one);
    auto res = to_string(nanunit);
    EXPECT_EQ(res, "NaN");
    auto nanresult = unit_from_string(res);
    EXPECT_TRUE(isnan(nanresult));
    EXPECT_EQ(to_string(nanunit * precise::m / precise::s), "NaN*m/s");

    EXPECT_EQ(
        to_string(unit(std::numeric_limits<double>::signaling_NaN(), m / s)),
        "NaN*m/s");
    auto retunit = unit_from_string("NaN*m/s");
    EXPECT_EQ(retunit.base_units(), (precise::m / precise::s).base_units());
    EXPECT_TRUE(isnan(retunit));
}